

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm.cxx
# Opt level: O3

void outTime(string *name,size_t LEN,size_t FLOPS,double count)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 in_XMM1 [16];
  
  lVar1 = std::cout;
  *(undefined8 *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) = 0xf;
  *(uint *)(std::ostream::_M_insert<double> + *(long *)(lVar1 + -0x18)) =
       *(uint *)(std::ostream::_M_insert<double> + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x20;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(name->_M_dataplus)._M_p,name->_M_string_length);
  lVar1 = std::cout;
  *(undefined8 *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) = 0xf;
  *(uint *)(std::ostream::_M_insert<double> + *(long *)(lVar1 + -0x18)) =
       *(uint *)(std::ostream::_M_insert<double> + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x20;
  std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  lVar1 = std::cout;
  *(undefined8 *)(std::random_device::_M_getval + *(long *)(std::cout + -0x18)) = 8;
  *(undefined8 *)(std::ios_base::Init::Init + *(long *)(lVar1 + -0x18)) = 0xf;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(std::ostream::_M_insert<double> + lVar1) =
       *(uint *)(std::ostream::_M_insert<double> + lVar1) & 0xffffff4f | 0x80;
  std::ostream::_M_insert<double>(count);
  lVar1 = std::cout;
  auVar2 = vcvtusi2sd_avx512f(in_XMM1,FLOPS);
  *(undefined8 *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) = 0xf;
  *(uint *)(std::ostream::_M_insert<double> + *(long *)(lVar1 + -0x18)) =
       *(uint *)(std::ostream::_M_insert<double> + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x80;
  std::ostream::_M_insert<double>((auVar2._0_8_ / count) / 1000000000.0);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  return;
}

Assistant:

void outTime(std::string name, size_t LEN, size_t FLOPS, double count) {

  std::cout << std::setw(15) << std::left  << name;
  std::cout << std::setw(15) << std::left << LEN;

  std::cout << std::setprecision(8);

  std::cout << std::setw(15) << std::right << count;
  std::cout << std::setw(15) << std::right << FLOPS/count/1.e9;

  std::cout << std::endl;



}